

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_heap.c
# Opt level: O0

void vmcache_heap_remove(heap *heap,extent *ext)

{
  header *phVar1;
  header *phVar2;
  header *header_prev;
  header *header_next;
  header *header;
  extent *ext_local;
  heap *heap_local;
  
  phVar1 = vmcache_extent_get_header(ext->ptr);
  if (phVar1->next != (ptr_ext_t *)0x0) {
    phVar2 = vmcache_extent_get_header(phVar1->next);
    phVar2->prev = phVar1->prev;
  }
  if (phVar1->prev != (ptr_ext_t *)0x0) {
    phVar2 = vmcache_extent_get_header(phVar1->prev);
    phVar2->next = phVar1->next;
  }
  if (heap->first_extent == ext->ptr) {
    heap->first_extent = phVar1->next;
  }
  heap->entries = heap->entries - 1;
  return;
}

Assistant:

static void
vmcache_heap_remove(struct heap *heap, struct extent *ext)
{
	LOG(3, "heap %p ext %p", heap, ext);

	struct header *header = vmcache_extent_get_header(ext->ptr);

	ASSERT(header->next || header->prev ||
			(heap->first_extent == ext->ptr));

	if (header->next) {
		struct header *header_next =
				vmcache_extent_get_header(header->next);
		ASSERTeq(header_next->prev, ext->ptr);
		header_next->prev = header->prev;
	}

	if (header->prev) {
		struct header *header_prev =
				vmcache_extent_get_header(header->prev);
		ASSERTeq(header_prev->next, ext->ptr);
		header_prev->next = header->next;
	}

	if (heap->first_extent == ext->ptr)
		heap->first_extent = header->next;

#ifdef STATS_ENABLED
	heap->entries--;
#endif
}